

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

void __thiscall WScriptJsrt::ModuleMessage::~ModuleMessage(ModuleMessage *this)

{
  string *this_00;
  
  (this->super_MessageBase)._vptr_MessageBase = (_func_int **)&PTR__ModuleMessage_001873a0;
  (*ChakraRTInterface::m_jsApiHooks.pfJsrtRelease)(this->moduleRecord,(uint *)0x0);
  if (this->specifier != (JsValueRef)0x0) {
    this_00 = this->fullPath;
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
    }
    operator_delete(this_00);
    (*ChakraRTInterface::m_jsApiHooks.pfJsrtRelease)(this->specifier,(uint *)0x0);
  }
  return;
}

Assistant:

WScriptJsrt::ModuleMessage::~ModuleMessage()
{
    ChakraRTInterface::JsRelease(moduleRecord, nullptr);
    if (specifier != nullptr)
    {
        delete fullPath;
        ChakraRTInterface::JsRelease(specifier, nullptr);
    }
}